

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O1

string * __thiscall
(anonymous_namespace)::BIP32PubkeyProvider::ToString_abi_cxx11_
          (string *__return_storage_ptr__,void *this,StringType type,bool normalized)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  undefined7 in_register_00000009;
  char __c;
  undefined8 uVar4;
  long in_FS_OFFSET;
  bool apostrophe;
  string local_68;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (((int)CONCAT71(in_register_00000009,normalized) != 0) ||
     (apostrophe = true, *(char *)((long)this + 0x9c) == '\0')) {
    apostrophe = type == COMPAT;
  }
  EncodeExtPubKey_abi_cxx11_(&local_48,(CExtPubKey *)((long)this + 0xc));
  FormatHDKeypath_abi_cxx11_
            (&local_68,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)((long)this + 0x80),
             apostrophe);
  uVar4 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    uVar4 = local_48.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar4 < local_68._M_string_length + local_48._M_string_length) {
    uVar4 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      uVar4 = local_68.field_2._M_allocated_capacity;
    }
    if (local_68._M_string_length + local_48._M_string_length <= (ulong)uVar4) {
      pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_68,0,0,local_48._M_dataplus._M_p,local_48._M_string_length);
      goto LAB_0039928f;
    }
  }
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_48,local_68._M_dataplus._M_p,local_68._M_string_length);
LAB_0039928f:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (pbVar3->_M_dataplus)._M_p;
  paVar1 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar4 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar4;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar3->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (*(int *)((long)this + 0x98) != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,"/*");
    if (*(int *)((long)this + 0x98) == 2) {
      __c = 'h';
      if (apostrophe != false) {
        __c = '\'';
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (__return_storage_ptr__,__c);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string ToString(StringType type, bool normalized) const
    {
        // If StringType==COMPAT, always use the apostrophe to stay compatible with previous versions
        const bool use_apostrophe = (!normalized && m_apostrophe) || type == StringType::COMPAT;
        std::string ret = EncodeExtPubKey(m_root_extkey) + FormatHDKeypath(m_path, /*apostrophe=*/use_apostrophe);
        if (IsRange()) {
            ret += "/*";
            if (m_derive == DeriveType::HARDENED) ret += use_apostrophe ? '\'' : 'h';
        }
        return ret;
    }